

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O0

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  TestCaseInfo *this_00;
  ostream *poVar4;
  long in_RSI;
  long in_RDI;
  MessageInfo *messageInfo;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range3;
  ReusableStringStream msg;
  AssertionResult *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  AssertionResult *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd60;
  ReusableStringStream *in_stack_fffffffffffffd70;
  AssertionResult *in_stack_fffffffffffffd78;
  ReusableStringStream *in_stack_fffffffffffffd80;
  AssertionResult *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd98;
  TeamCityReporter *in_stack_fffffffffffffda0;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  reference local_e0;
  MessageInfo *local_d8;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_d0;
  long local_c8;
  string *in_stack_ffffffffffffff98;
  ReusableStringStream local_30;
  AssertionResult *local_18;
  long local_10;
  
  local_18 = (AssertionResult *)(in_RSI + 8);
  local_10 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffd40);
  if (bVar1) {
LAB_00166f2f:
    std::ostream::flush();
    return true;
  }
  ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffd70);
  if ((*(byte *)(in_RDI + 0x162) & 1) == 0) {
    ReusableStringStream::get(&local_30);
    printSectionHeader(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  }
  *(undefined1 *)(in_RDI + 0x162) = 1;
  AssertionResult::getSourceInfo(local_18);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd40,
             (SourceLineInfo *)in_stack_fffffffffffffd38);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd40,
             (char (*) [2])in_stack_fffffffffffffd38);
  OVar2 = AssertionResult::getResultType(local_18);
  if (OVar2 != Unknown) {
    if ((uint)OVar2 < 3) {
      ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffd70);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd40,
                 (char (*) [36])in_stack_fffffffffffffd38);
      ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd38);
      throw_domain_error(in_stack_fffffffffffffd60);
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [18])in_stack_fffffffffffffd38);
      }
      else if (OVar2 == ExplicitFailure) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [17])in_stack_fffffffffffffd38);
      }
      else {
        if (OVar2 == Exception) goto LAB_00166828;
        if (OVar2 == ThrewException) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffd40,
                     (char (*) [21])in_stack_fffffffffffffd38);
        }
        else if (OVar2 == DidntThrowException) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffd40,
                     (char (*) [47])in_stack_fffffffffffffd38);
        }
        else if (OVar2 == FatalErrorCondition) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffd40,
                     (char (*) [22])in_stack_fffffffffffffd38);
        }
      }
      sVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                         (local_10 + 0x98));
      if (sVar3 == 1) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [15])in_stack_fffffffffffffd38);
      }
      sVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                         (local_10 + 0x98));
      if (1 < sVar3) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [16])in_stack_fffffffffffffd38);
      }
      local_c8 = local_10 + 0x98;
      local_d0._M_current =
           (MessageInfo *)
           clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                     ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                      in_stack_fffffffffffffd38);
      local_d8 = (MessageInfo *)
                 clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                           ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                            in_stack_fffffffffffffd38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)in_stack_fffffffffffffd40,
                                (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)in_stack_fffffffffffffd38), bVar1) {
        local_e0 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator*(&local_d0);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [5])in_stack_fffffffffffffd38);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [2])in_stack_fffffffffffffd38);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++(&local_d0);
      }
      bVar1 = AssertionResult::hasExpression((AssertionResult *)0x166a13);
      if (bVar1) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [4])in_stack_fffffffffffffd38);
        AssertionResult::getExpressionInMacro_abi_cxx11_(in_stack_fffffffffffffd88);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [18])in_stack_fffffffffffffd38);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [3])in_stack_fffffffffffffd38);
        AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffd78);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [2])in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_100);
      }
      this_00 = Option<Catch::TestCaseInfo>::operator->
                          ((Option<Catch::TestCaseInfo> *)(in_RDI + 0x90));
      bVar1 = TestCaseInfo::okToFail(this_00);
      if (bVar1) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffd40,
                   (char (*) [49])in_stack_fffffffffffffd38);
        poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),"##teamcity[testIgnored");
        poVar4 = std::operator<<(poVar4," name=\'");
        Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)(in_RDI + 0x90));
        escape(in_stack_ffffffffffffff98);
        poVar4 = std::operator<<(poVar4,local_140);
        poVar4 = std::operator<<(poVar4,"\'");
        poVar4 = std::operator<<(poVar4," message=\'");
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd38);
        escape(in_stack_ffffffffffffff98);
        in_stack_fffffffffffffd80 = (ReusableStringStream *)std::operator<<(poVar4,local_160);
        poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffd80,"\'");
        std::operator<<(poVar4,"]\n");
        std::__cxx11::string::~string(local_160);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string(local_140);
      }
      else {
        poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),"##teamcity[testFailed");
        poVar4 = std::operator<<(poVar4," name=\'");
        Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)(in_RDI + 0x90));
        escape(in_stack_ffffffffffffff98);
        poVar4 = std::operator<<(poVar4,local_1a0);
        poVar4 = std::operator<<(poVar4,"\'");
        poVar4 = std::operator<<(poVar4," message=\'");
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd38);
        escape(in_stack_ffffffffffffff98);
        poVar4 = std::operator<<(poVar4,local_1c0);
        poVar4 = std::operator<<(poVar4,"\'");
        std::operator<<(poVar4,"]\n");
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::string::~string(local_1a0);
      }
      ReusableStringStream::~ReusableStringStream(in_stack_fffffffffffffd80);
      goto LAB_00166f2f;
    }
  }
LAB_00166828:
  ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffd70);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd40,
             (char (*) [16])in_stack_fffffffffffffd38);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd38);
  throw_domain_error(in_stack_fffffffffffffd60);
}

Assistant:

bool assertionEnded( AssertionStats const& assertionStats ) override {
            AssertionResult const& result = assertionStats.assertionResult;
            if( !result.isOk() ) {

                ReusableStringStream msg;
                if( !m_headerPrintedForThisSection )
                    printSectionHeader( msg.get() );
                m_headerPrintedForThisSection = true;

                msg << result.getSourceInfo() << "\n";

                switch( result.getResultType() ) {
                    case ResultWas::ExpressionFailed:
                        msg << "expression failed";
                        break;
                    case ResultWas::ThrewException:
                        msg << "unexpected exception";
                        break;
                    case ResultWas::FatalErrorCondition:
                        msg << "fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        msg << "no exception was thrown where one was expected";
                        break;
                    case ResultWas::ExplicitFailure:
                        msg << "explicit failure";
                        break;

                    // We shouldn't get here because of the isOk() test
                    case ResultWas::Ok:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                        CATCH_ERROR( "Internal error in TeamCity reporter" );
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        CATCH_ERROR( "Not implemented" );
                }
                if( assertionStats.infoMessages.size() == 1 )
                    msg << " with message:";
                if( assertionStats.infoMessages.size() > 1 )
                    msg << " with messages:";
                for( auto const& messageInfo : assertionStats.infoMessages )
                    msg << "\n  \"" << messageInfo.message << "\"";


                if( result.hasExpression() ) {
                    msg <<
                        "\n  " << result.getExpressionInMacro() << "\n"
                        "with expansion:\n" <<
                        "  " << result.getExpandedExpression() << "\n";
                }

                if( currentTestCaseInfo->okToFail() ) {
                    msg << "- failure ignore as test marked as 'ok to fail'\n";
                    stream << "##teamcity[testIgnored"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
                else {
                    stream << "##teamcity[testFailed"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
            }
            stream.flush();
            return true;
        }